

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2mem.cpp
# Opt level: O1

string * path_to_varname_abi_cxx11_(string *__return_storage_ptr__,char *path)

{
  char *pcVar1;
  char *__s;
  allocator<char> local_11;
  
  pcVar1 = strrchr(path,0x2f);
  __s = pcVar1 + 1;
  if (pcVar1 == (char *)0x0) {
    __s = path;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,&local_11)
  ;
  sanitize_name((__return_storage_ptr__->_M_dataplus)._M_p);
  return __return_storage_ptr__;
}

Assistant:

static std::string path_to_varname(const char* path)
{
    const char* lastslash = strrchr(path, '/');
    const char* name = lastslash == NULL ? path : lastslash + 1;

    std::string varname = name;
    sanitize_name((char*)varname.c_str());

    return varname;
}